

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int katherine_set_dacs(katherine_device_t *device,katherine_dacs_t *dacs)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  bool bVar6;
  char cmd [8];
  char ack [8];
  ulong local_40 [2];
  
  iVar2 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar2 == 0) {
    lVar5 = 0;
    do {
      local_40[0]._0_5_ = (uint5)(byte)lVar5 << 0x20;
      local_40[0] = (ulong)CONCAT25(0x400,(int5)local_40[0]);
      uVar3 = (ulong)dacs->array[lVar5];
      puVar4 = local_40;
      if (uVar3 != 0) {
        do {
          *(char *)puVar4 = (char)uVar3;
          bVar6 = 0xff < uVar3;
          puVar4 = (ulong *)((long)puVar4 + 1);
          uVar3 = uVar3 >> 8;
        } while (bVar6);
      }
      iVar2 = katherine_udp_send_exact(&device->control_socket,local_40,8);
      if (iVar2 == 0) {
        iVar2 = katherine_udp_recv_exact(&device->control_socket,local_40 + 1,8);
        bVar6 = iVar2 == 0;
        cVar1 = !bVar6 * '\x02';
      }
      else {
        cVar1 = '\x02';
        bVar6 = false;
      }
      if (!bVar6) goto LAB_001044be;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x12);
    cVar1 = '\x03';
LAB_001044be:
    if (cVar1 != '\x02') {
      if (cVar1 != '\x03') {
        return iVar2;
      }
      local_40[1] = 0x7000000000001;
      iVar2 = katherine_udp_send_exact(&device->control_socket,local_40 + 1,8);
      if (iVar2 == 0) {
        iVar2 = katherine_udp_recv_exact(&device->control_socket,local_40 + 1,8);
      }
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar2;
}

Assistant:

int
katherine_set_dacs(katherine_device_t *device, const katherine_dacs_t *dacs)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    for (int i = 0; i < 18; ++i) {
        char cmd[8] = {0};
        cmd[6] = CMD_TYPE_INTERNAL_DAC_SETTINGS;
        cmd[4] = (char) i;
        katherine_cmd_long(cmd, dacs->array[i]);

        res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
        if (res) goto err;

        res = katherine_cmd_wait_ack(&device->control_socket);
        if (res) goto err;
    }

    res = katherine_cmd_hw_internal_dac_update(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}